

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O3

int __thiscall userinfo_t::TeamChanged(userinfo_t *this,int team)

{
  bool bVar1;
  Node *pNVar2;
  UCVarValue value;
  FName local_14;
  
  if (teamplay.Value) {
    bVar1 = FTeam::IsValidTeam(&TeamLibrary,team);
    if (!bVar1) {
      team = D_PickRandomTeam();
    }
  }
  pNVar2 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::GetNode
                     (&this->
                       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      ,&local_14);
  value._4_4_ = 0;
  value.Int = team;
  FBaseCVar::SetGenericRep((pNVar2->Pair).Value,value,CVAR_Int);
  return team;
}

Assistant:

int userinfo_t::TeamChanged(int team)
{
	if (teamplay && !TeamLibrary.IsValidTeam(team))
	{ // Force players onto teams in teamplay mode
		team = D_PickRandomTeam();
	}
	*static_cast<FIntCVar *>((*this)[NAME_Team]) = team;
	return team;
}